

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplerng.c
# Opt level: O0

int simplerng_poisson_small(double lambda)

{
  int iVar1;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  int k;
  double L;
  double p;
  undefined4 local_1c;
  undefined8 local_10;
  
  local_10 = 1.0;
  dVar2 = exp(-in_XMM0_Qa);
  local_1c = 0;
  iVar1 = local_1c;
  do {
    local_1c = iVar1;
    dVar3 = simplerng_getuniform();
    local_10 = dVar3 * local_10;
    iVar1 = local_1c + 1;
  } while (dVar2 < local_10);
  return local_1c;
}

Assistant:

int simplerng_poisson_small(double lambda)
{
  /* Algorithm due to Donald Knuth, 1969. */
  double p = 1.0, L = exp(-lambda);
  int k = 0;
  do {
    k++;
    p *= simplerng_getuniform();
  }
  while (p > L);
  return k - 1;
}